

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O0

Own<capnp::_::CapTableBuilder,_std::nullptr_t> __thiscall
capnp::_::BuilderArena::releaseLocalCapTable(BuilderArena *this)

{
  LocalCapTable *orig;
  CapTableBuilder *extraout_RDX;
  long in_RSI;
  Own<capnp::_::CapTableBuilder,_std::nullptr_t> OVar1;
  Own<capnp::_::BuilderArena::LocalCapTable,_std::nullptr_t> local_28;
  BuilderArena *this_local;
  
  this_local = this;
  orig = kj::mv<capnp::_::BuilderArena::LocalCapTable>((LocalCapTable *)(in_RSI + 0x18));
  kj::heap<capnp::_::BuilderArena::LocalCapTable>((kj *)&local_28,orig);
  kj::Own<capnp::_::CapTableBuilder,decltype(nullptr)>::
  Own<capnp::_::BuilderArena::LocalCapTable,void>
            ((Own<capnp::_::CapTableBuilder,decltype(nullptr)> *)this,&local_28);
  kj::Own<capnp::_::BuilderArena::LocalCapTable,_std::nullptr_t>::~Own(&local_28);
  OVar1.ptr = extraout_RDX;
  OVar1.disposer = (Disposer *)this;
  return OVar1;
}

Assistant:

kj::Own<_::CapTableBuilder> releaseLocalCapTable() {
    return kj::heap<LocalCapTable>(kj::mv(localCapTable));
  }